

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O1

void glmc_rotated_at(vec4 *m,float *pivot,float angle,float *axis)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fStack_24;
  
  uVar2 = *(undefined8 *)pivot;
  fVar10 = (float)uVar2;
  fVar1 = pivot[2];
  m[3][0] = m[3][0] + fVar10;
  fVar5 = m[3][2];
  m[3][1] = m[3][1] + pivot[1];
  m[3][2] = fVar5 + pivot[2];
  fVar5 = cosf(angle);
  fVar6 = axis[2] * axis[2] + *axis * *axis + axis[1] * axis[1];
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar14 = 0.0;
  fVar11 = 0.0;
  fVar13 = 0.0;
  if (1.1920929e-07 <= fVar6) {
    fVar6 = 1.0 / fVar6;
    fVar14 = *axis * fVar6;
    fVar11 = fVar6 * (float)*(undefined8 *)(axis + 1);
    fVar13 = fVar6 * (float)((ulong)*(undefined8 *)(axis + 1) >> 0x20);
  }
  fVar6 = 1.0 - fVar5;
  fVar16 = fVar6 * fVar14;
  fVar17 = fVar6 * fVar11;
  fVar6 = fVar6 * fVar13;
  fVar7 = sinf(angle);
  fVar20 = fVar14 * fVar17 - fVar7 * fVar13;
  fVar18 = fVar5 + fVar16 * fVar14;
  fVar19 = fVar7 * fVar13 + fVar16 * fVar11;
  fVar12 = fVar14 * fVar6 + fVar11 * fVar7;
  fVar21 = fVar11 * fVar6 - fVar14 * fVar7;
  fVar15 = fVar16 * fVar13 - fVar11 * fVar7;
  fVar8 = fVar5 + fVar17 * fVar11;
  fVar9 = fVar14 * fVar7 + fVar17 * fVar13;
  fVar5 = fVar6 * fVar13 + fVar5;
  fVar6 = (*m)[0];
  fVar11 = (*m)[1];
  fVar13 = (*m)[2];
  fVar14 = m[1][0];
  fVar7 = m[1][1];
  fVar16 = m[1][2];
  fVar17 = m[2][0];
  fVar3 = m[2][1];
  fVar4 = m[2][2];
  (*m)[0] = fVar13 * fVar12 + fVar11 * fVar20 + fVar6 * fVar18;
  (*m)[1] = fVar13 * fVar21 + fVar11 * fVar8 + fVar6 * fVar19;
  (*m)[2] = fVar13 * fVar5 + fVar11 * fVar9 + fVar6 * fVar15;
  (*m)[3] = fVar13 * 0.0 + fVar11 * 0.0 + fVar6 * 0.0;
  m[1][0] = fVar16 * fVar12 + fVar7 * fVar20 + fVar14 * fVar18;
  m[1][1] = fVar16 * fVar21 + fVar7 * fVar8 + fVar14 * fVar19;
  m[1][2] = fVar16 * fVar5 + fVar7 * fVar9 + fVar14 * fVar15;
  m[1][3] = fVar16 * 0.0 + fVar7 * 0.0 + fVar14 * 0.0;
  m[2][0] = fVar4 * fVar12 + fVar3 * fVar20 + fVar17 * fVar18;
  m[2][1] = fVar4 * fVar21 + fVar3 * fVar8 + fVar17 * fVar19;
  m[2][2] = fVar4 * fVar5 + fVar3 * fVar9 + fVar17 * fVar15;
  m[2][3] = fVar4 * 0.0 + fVar3 * 0.0 + fVar17 * 0.0;
  *(float *)((long)(m + 3) + 0) = 0.0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  *(float *)((long)(m + 3) + 0xc) = 1.0;
  fStack_24 = (float)((ulong)uVar2 >> 0x20);
  *(ulong *)m[3] = CONCAT44(m[3][1] - fStack_24,0.0 - fVar10);
  m[3][2] = m[3][2] - fVar1;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotated_at(mat4 m, vec3 pivot, float angle, vec3 axis) {
  glm_rotated_at(m, pivot, angle, axis);
}